

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall sznet::net::TcpClient::disconnect(TcpClient *this)

{
  bool bVar1;
  element_type *this_00;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  TcpClient *this_local;
  
  this->m_connect = false;
  lock.m_mutex = (MutexLock *)this;
  MutexLockGuard::MutexLockGuard(&local_18,&this->m_mutex);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_connection);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_connection);
    TcpConnection::forceClose(this_00);
  }
  MutexLockGuard::~MutexLockGuard(&local_18);
  return;
}

Assistant:

void TcpClient::disconnect()
{
	m_connect = false;

	{
		MutexLockGuard lock(m_mutex);
		if (m_connection)
		{
			// m_connection->shutdown();
			m_connection->forceClose();
		}
	}
}